

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  NodeRef root;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  byte bVar17;
  byte bVar18;
  ulong uVar19;
  uint uVar20;
  undefined4 uVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  byte bVar25;
  ulong *puVar26;
  long lVar27;
  undefined1 (*pauVar28) [32];
  bool bVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar32 [16];
  undefined1 auVar44 [32];
  undefined1 auVar33 [16];
  undefined1 auVar45 [32];
  undefined1 auVar34 [16];
  undefined1 auVar46 [32];
  undefined1 auVar35 [16];
  undefined1 auVar47 [32];
  undefined1 auVar36 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  Precalculations pre;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_28b1;
  BVH *local_28b0;
  undefined4 local_28a4;
  Intersectors *local_28a0;
  RayK<8> *local_2898;
  RayQueryContext *local_2890;
  RayK<8> *local_2888;
  undefined1 local_2880 [32];
  size_t local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [32];
  int local_26c0;
  int iStack_26bc;
  int iStack_26b8;
  int iStack_26b4;
  int iStack_26b0;
  int iStack_26ac;
  int iStack_26a8;
  int iStack_26a4;
  uint local_26a0;
  uint uStack_269c;
  uint uStack_2698;
  uint uStack_2694;
  uint uStack_2690;
  uint uStack_268c;
  uint uStack_2688;
  uint uStack_2684;
  uint local_2680;
  uint uStack_267c;
  uint uStack_2678;
  uint uStack_2674;
  uint uStack_2670;
  uint uStack_266c;
  uint uStack_2668;
  uint uStack_2664;
  uint local_2660;
  uint uStack_265c;
  uint uStack_2658;
  uint uStack_2654;
  uint uStack_2650;
  uint uStack_264c;
  uint uStack_2648;
  uint uStack_2644;
  uint local_2640;
  uint uStack_263c;
  uint uStack_2638;
  uint uStack_2634;
  uint uStack_2630;
  uint uStack_262c;
  uint uStack_2628;
  uint uStack_2624;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  
  local_28b0 = (BVH *)This->ptr;
  if ((local_28b0->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar39 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar31 = ZEXT816(0) << 0x40;
      uVar30 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar31),5);
      uVar19 = vpcmpeqd_avx512vl(auVar39,(undefined1  [32])valid_i->field_0);
      uVar30 = uVar30 & uVar19;
      bVar18 = (byte)uVar30;
      if (bVar18 != 0) {
        local_2840._0_4_ = *(undefined4 *)ray;
        local_2840._4_4_ = *(undefined4 *)(ray + 4);
        local_2840._8_4_ = *(undefined4 *)(ray + 8);
        local_2840._12_4_ = *(undefined4 *)(ray + 0xc);
        local_2840._16_4_ = *(undefined4 *)(ray + 0x10);
        local_2840._20_4_ = *(undefined4 *)(ray + 0x14);
        local_2840._24_4_ = *(undefined4 *)(ray + 0x18);
        local_2840._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_2840._32_4_ = *(undefined4 *)(ray + 0x20);
        local_2840._36_4_ = *(undefined4 *)(ray + 0x24);
        local_2840._40_4_ = *(undefined4 *)(ray + 0x28);
        local_2840._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_2840._48_4_ = *(undefined4 *)(ray + 0x30);
        local_2840._52_4_ = *(undefined4 *)(ray + 0x34);
        local_2840._56_4_ = *(undefined4 *)(ray + 0x38);
        local_2840._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_2840._64_4_ = *(undefined4 *)(ray + 0x40);
        local_2840._68_4_ = *(undefined4 *)(ray + 0x44);
        local_2840._72_4_ = *(undefined4 *)(ray + 0x48);
        local_2840._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_2840._80_4_ = *(undefined4 *)(ray + 0x50);
        local_2840._84_4_ = *(undefined4 *)(ray + 0x54);
        local_2840._88_4_ = *(undefined4 *)(ray + 0x58);
        local_2840._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar42._8_4_ = 0x7fffffff;
        auVar42._0_8_ = 0x7fffffff7fffffff;
        auVar42._12_4_ = 0x7fffffff;
        auVar42._16_4_ = 0x7fffffff;
        auVar42._20_4_ = 0x7fffffff;
        auVar42._24_4_ = 0x7fffffff;
        auVar42._28_4_ = 0x7fffffff;
        auVar39 = vandps_avx(auVar42,local_27e0);
        auVar37._8_4_ = 0x219392ef;
        auVar37._0_8_ = 0x219392ef219392ef;
        auVar37._12_4_ = 0x219392ef;
        auVar37._16_4_ = 0x219392ef;
        auVar37._20_4_ = 0x219392ef;
        auVar37._24_4_ = 0x219392ef;
        auVar37._28_4_ = 0x219392ef;
        uVar19 = vcmpps_avx512vl(auVar39,auVar37,1);
        bVar29 = (bool)((byte)uVar19 & 1);
        auVar38._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27e0._0_4_;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27e0._4_4_;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27e0._8_4_;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27e0._12_4_;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar38._16_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27e0._16_4_;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar38._20_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27e0._20_4_;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar38._24_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27e0._24_4_;
        bVar29 = SUB81(uVar19 >> 7,0);
        auVar38._28_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27e0._28_4_;
        auVar39 = vandps_avx(auVar42,local_27c0);
        uVar19 = vcmpps_avx512vl(auVar39,auVar37,1);
        bVar29 = (bool)((byte)uVar19 & 1);
        auVar40._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27c0._0_4_;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27c0._4_4_;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27c0._8_4_;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27c0._12_4_;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar40._16_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27c0._16_4_;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar40._20_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27c0._20_4_;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar40._24_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27c0._24_4_;
        bVar29 = SUB81(uVar19 >> 7,0);
        auVar40._28_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27c0._28_4_;
        auVar39 = vandps_avx(auVar42,local_27a0);
        uVar19 = vcmpps_avx512vl(auVar39,auVar37,1);
        bVar29 = (bool)((byte)uVar19 & 1);
        auVar39._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27a0._0_4_;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar39._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27a0._4_4_;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar39._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27a0._8_4_;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar39._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27a0._12_4_;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar39._16_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27a0._16_4_;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar39._20_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27a0._20_4_;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar39._24_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27a0._24_4_;
        bVar29 = SUB81(uVar19 >> 7,0);
        auVar39._28_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_27a0._28_4_;
        auVar41._8_4_ = 0x3f800000;
        auVar41._0_8_ = &DAT_3f8000003f800000;
        auVar41._12_4_ = 0x3f800000;
        auVar41._16_4_ = 0x3f800000;
        auVar41._20_4_ = 0x3f800000;
        auVar41._24_4_ = 0x3f800000;
        auVar41._28_4_ = 0x3f800000;
        auVar37 = vrcp14ps_avx512vl(auVar38);
        auVar32 = vfnmadd213ps_fma(auVar38,auVar37,auVar41);
        auVar32 = vfmadd132ps_fma(ZEXT1632(auVar32),auVar37,auVar37);
        auVar38 = vrcp14ps_avx512vl(auVar40);
        auVar33 = vfnmadd213ps_fma(auVar40,auVar38,auVar41);
        auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar38,auVar38);
        auVar38 = vrcp14ps_avx512vl(auVar39);
        auVar34 = vfnmadd213ps_fma(auVar39,auVar38,auVar41);
        local_2780 = ZEXT1632(auVar32);
        local_2760 = ZEXT1632(auVar33);
        auVar34 = vfmadd132ps_fma(ZEXT1632(auVar34),auVar38,auVar38);
        local_2740 = ZEXT1632(auVar34);
        local_2720 = (float)local_2840._0_4_ * auVar32._0_4_;
        fStack_271c = (float)local_2840._4_4_ * auVar32._4_4_;
        fStack_2718 = (float)local_2840._8_4_ * auVar32._8_4_;
        fStack_2714 = (float)local_2840._12_4_ * auVar32._12_4_;
        fStack_2710 = (float)local_2840._16_4_ * 0.0;
        fStack_270c = (float)local_2840._20_4_ * 0.0;
        fStack_2708 = (float)local_2840._24_4_ * 0.0;
        local_2700 = (float)local_2840._32_4_ * auVar33._0_4_;
        fStack_26fc = (float)local_2840._36_4_ * auVar33._4_4_;
        fStack_26f8 = (float)local_2840._40_4_ * auVar33._8_4_;
        fStack_26f4 = (float)local_2840._44_4_ * auVar33._12_4_;
        fStack_26f0 = (float)local_2840._48_4_ * 0.0;
        fStack_26ec = (float)local_2840._52_4_ * 0.0;
        fStack_26e8 = (float)local_2840._56_4_ * 0.0;
        local_26e0._4_4_ = (float)local_2840._68_4_ * auVar34._4_4_;
        local_26e0._0_4_ = (float)local_2840._64_4_ * auVar34._0_4_;
        local_26e0._8_4_ = (float)local_2840._72_4_ * auVar34._8_4_;
        local_26e0._12_4_ = (float)local_2840._76_4_ * auVar34._12_4_;
        local_26e0._16_4_ = (float)local_2840._80_4_ * 0.0;
        local_26e0._20_4_ = (float)local_2840._84_4_ * 0.0;
        local_26e0._24_4_ = (float)local_2840._88_4_ * 0.0;
        local_26e0._28_4_ = local_2840._92_4_;
        uVar19 = vcmpps_avx512vl(ZEXT1632(auVar32),ZEXT1632(auVar31),1);
        auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_26c0 = (uint)((byte)uVar19 & 1) * auVar39._0_4_;
        iStack_26bc = (uint)((byte)(uVar19 >> 1) & 1) * auVar39._4_4_;
        iStack_26b8 = (uint)((byte)(uVar19 >> 2) & 1) * auVar39._8_4_;
        iStack_26b4 = (uint)((byte)(uVar19 >> 3) & 1) * auVar39._12_4_;
        iStack_26b0 = (uint)((byte)(uVar19 >> 4) & 1) * auVar39._16_4_;
        iStack_26ac = (uint)((byte)(uVar19 >> 5) & 1) * auVar39._20_4_;
        iStack_26a8 = (uint)((byte)(uVar19 >> 6) & 1) * auVar39._24_4_;
        iStack_26a4 = (uint)(byte)(uVar19 >> 7) * auVar39._28_4_;
        auVar38 = ZEXT1632(auVar31);
        uVar19 = vcmpps_avx512vl(ZEXT1632(auVar33),auVar38,5);
        auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar29 = (bool)((byte)uVar19 & 1);
        local_26a0 = (uint)bVar29 * auVar39._0_4_ | (uint)!bVar29 * 0x30;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        uStack_269c = (uint)bVar29 * auVar39._4_4_ | (uint)!bVar29 * 0x30;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        uStack_2698 = (uint)bVar29 * auVar39._8_4_ | (uint)!bVar29 * 0x30;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        uStack_2694 = (uint)bVar29 * auVar39._12_4_ | (uint)!bVar29 * 0x30;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        uStack_2690 = (uint)bVar29 * auVar39._16_4_ | (uint)!bVar29 * 0x30;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        uStack_268c = (uint)bVar29 * auVar39._20_4_ | (uint)!bVar29 * 0x30;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        uStack_2688 = (uint)bVar29 * auVar39._24_4_ | (uint)!bVar29 * 0x30;
        bVar29 = SUB81(uVar19 >> 7,0);
        uStack_2684 = (uint)bVar29 * auVar39._28_4_ | (uint)!bVar29 * 0x30;
        uVar19 = vcmpps_avx512vl(ZEXT1632(auVar34),auVar38,5);
        auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar29 = (bool)((byte)uVar19 & 1);
        local_2680 = (uint)bVar29 * auVar39._0_4_ | (uint)!bVar29 * 0x50;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        uStack_267c = (uint)bVar29 * auVar39._4_4_ | (uint)!bVar29 * 0x50;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        uStack_2678 = (uint)bVar29 * auVar39._8_4_ | (uint)!bVar29 * 0x50;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        uStack_2674 = (uint)bVar29 * auVar39._12_4_ | (uint)!bVar29 * 0x50;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        uStack_2670 = (uint)bVar29 * auVar39._16_4_ | (uint)!bVar29 * 0x50;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        uStack_266c = (uint)bVar29 * auVar39._20_4_ | (uint)!bVar29 * 0x50;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        uStack_2668 = (uint)bVar29 * auVar39._24_4_ | (uint)!bVar29 * 0x50;
        bVar29 = SUB81(uVar19 >> 7,0);
        uStack_2664 = (uint)bVar29 * auVar39._28_4_ | (uint)!bVar29 * 0x50;
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar62 = ZEXT3264(local_1e80);
        auVar39 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar38);
        local_2660 = (uint)(bVar18 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
        bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
        uStack_265c = (uint)bVar29 * auVar39._4_4_ | (uint)!bVar29 * 0x7f800000;
        bVar29 = (bool)((byte)(uVar30 >> 2) & 1);
        uStack_2658 = (uint)bVar29 * auVar39._8_4_ | (uint)!bVar29 * 0x7f800000;
        bVar29 = (bool)((byte)(uVar30 >> 3) & 1);
        uStack_2654 = (uint)bVar29 * auVar39._12_4_ | (uint)!bVar29 * 0x7f800000;
        bVar29 = (bool)((byte)(uVar30 >> 4) & 1);
        uStack_2650 = (uint)bVar29 * auVar39._16_4_ | (uint)!bVar29 * 0x7f800000;
        bVar29 = (bool)((byte)(uVar30 >> 5) & 1);
        uStack_264c = (uint)bVar29 * auVar39._20_4_ | (uint)!bVar29 * 0x7f800000;
        bVar29 = (bool)((byte)(uVar30 >> 6) & 1);
        uStack_2648 = (uint)bVar29 * auVar39._24_4_ | (uint)!bVar29 * 0x7f800000;
        bVar29 = SUB81(uVar30 >> 7,0);
        uStack_2644 = (uint)bVar29 * auVar39._28_4_ | (uint)!bVar29 * 0x7f800000;
        auVar60 = ZEXT3264(CONCAT428(0xff800000,
                                     CONCAT424(0xff800000,
                                               CONCAT420(0xff800000,
                                                         CONCAT416(0xff800000,
                                                                   CONCAT412(0xff800000,
                                                                             CONCAT48(0xff800000,
                                                                                                                                                                            
                                                  0xff800000ff800000)))))));
        local_28a4 = (undefined4)uVar30;
        auVar39 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar38);
        local_2640 = (uint)(bVar18 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar18 & 1) * -0x800000;
        bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
        uStack_263c = (uint)bVar29 * auVar39._4_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar30 >> 2) & 1);
        uStack_2638 = (uint)bVar29 * auVar39._8_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar30 >> 3) & 1);
        uStack_2634 = (uint)bVar29 * auVar39._12_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar30 >> 4) & 1);
        uStack_2630 = (uint)bVar29 * auVar39._16_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar30 >> 5) & 1);
        uStack_262c = (uint)bVar29 * auVar39._20_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar30 >> 6) & 1);
        uStack_2628 = (uint)bVar29 * auVar39._24_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = SUB81(uVar30 >> 7,0);
        uStack_2624 = (uint)bVar29 * auVar39._28_4_ | (uint)!bVar29 * -0x800000;
        bVar18 = ~bVar18;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar20 = 5;
        }
        else {
          uVar20 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2888 = ray + 0x100;
        puVar26 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar28 = (undefined1 (*) [32])local_1e40;
        local_2608 = (local_28b0->root).ptr;
        local_1e60 = local_2660;
        uStack_1e5c = uStack_265c;
        uStack_1e58 = uStack_2658;
        uStack_1e54 = uStack_2654;
        uStack_1e50 = uStack_2650;
        uStack_1e4c = uStack_264c;
        uStack_1e48 = uStack_2648;
        uStack_1e44 = uStack_2644;
        local_28a0 = This;
        local_2898 = ray;
        local_2890 = context;
        uStack_2704 = local_2840._28_4_;
        uStack_26e4 = local_2840._60_4_;
LAB_007a96cb:
        pauVar28 = pauVar28 + -1;
        root.ptr = puVar26[-1];
        puVar26 = puVar26 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_007a9de0;
        local_2880 = *pauVar28;
        auVar43._4_4_ = uStack_263c;
        auVar43._0_4_ = local_2640;
        auVar43._8_4_ = uStack_2638;
        auVar43._12_4_ = uStack_2634;
        auVar43._16_4_ = uStack_2630;
        auVar43._20_4_ = uStack_262c;
        auVar43._24_4_ = uStack_2628;
        auVar43._28_4_ = uStack_2624;
        uVar30 = vcmpps_avx512vl(local_2880,auVar43,1);
        if ((char)uVar30 == '\0') {
LAB_007a9df1:
          iVar16 = 2;
        }
        else {
          uVar21 = (undefined4)uVar30;
          iVar16 = 0;
          if ((uint)POPCOUNT(uVar21) <= uVar20) {
            do {
              local_2860 = 0;
              for (uVar19 = uVar30; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                local_2860 = local_2860 + 1;
              }
              bVar29 = occluded1(local_28a0,local_28b0,root,local_2860,&local_28b1,local_2898,
                                 (TravRayK<8,_false> *)&local_2840.field_0,local_2890);
              bVar17 = (byte)(1 << ((uint)local_2860 & 0x1f));
              if (!bVar29) {
                bVar17 = 0;
              }
              bVar18 = bVar18 | bVar17;
              uVar30 = uVar30 - 1 & uVar30;
            } while (uVar30 != 0);
            if (bVar18 == 0xff) {
              iVar16 = 3;
            }
            else {
              auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_2640 = (uint)(bVar18 & 1) * auVar39._0_4_ | !(bool)(bVar18 & 1) * local_2640;
              bVar29 = (bool)(bVar18 >> 1 & 1);
              uStack_263c = (uint)bVar29 * auVar39._4_4_ | !bVar29 * uStack_263c;
              bVar29 = (bool)(bVar18 >> 2 & 1);
              uStack_2638 = (uint)bVar29 * auVar39._8_4_ | !bVar29 * uStack_2638;
              bVar29 = (bool)(bVar18 >> 3 & 1);
              uStack_2634 = (uint)bVar29 * auVar39._12_4_ | !bVar29 * uStack_2634;
              bVar29 = (bool)(bVar18 >> 4 & 1);
              uStack_2630 = (uint)bVar29 * auVar39._16_4_ | !bVar29 * uStack_2630;
              bVar29 = (bool)(bVar18 >> 5 & 1);
              uStack_262c = (uint)bVar29 * auVar39._20_4_ | !bVar29 * uStack_262c;
              bVar29 = (bool)(bVar18 >> 6 & 1);
              uStack_2628 = (uint)bVar29 * auVar39._24_4_ | !bVar29 * uStack_2628;
              uStack_2624 = (uint)(bVar18 >> 7) * auVar39._28_4_ |
                            !(bool)(bVar18 >> 7) * uStack_2624;
              iVar16 = 2;
            }
            auVar60 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar62 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
          }
          if (uVar20 < (uint)POPCOUNT(uVar21)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007a9de0;
                auVar44._4_4_ = uStack_263c;
                auVar44._0_4_ = local_2640;
                auVar44._8_4_ = uStack_2638;
                auVar44._12_4_ = uStack_2634;
                auVar44._16_4_ = uStack_2630;
                auVar44._20_4_ = uStack_262c;
                auVar44._24_4_ = uStack_2628;
                auVar44._28_4_ = uStack_2624;
                uVar10 = vcmpps_avx512vl(auVar44,local_2880,6);
                if ((char)uVar10 == '\0') goto LAB_007a9df1;
                uVar30 = (ulong)((uint)root.ptr & 0xf);
                bVar17 = bVar18;
                if (uVar30 == 8) goto LAB_007a9dba;
                bVar17 = ~bVar18;
                uStack_2858 = *(undefined8 *)(local_2898 + 0x68);
                uStack_2850 = *(undefined8 *)(local_2898 + 0x70);
                uStack_2848 = *(undefined8 *)(local_2898 + 0x78);
                auVar39 = *(undefined1 (*) [32])(local_2898 + 0xa0);
                auVar38 = *(undefined1 (*) [32])(local_2898 + 0xc0);
                auVar40 = *(undefined1 (*) [32])(local_2898 + 0x80);
                lVar27 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar19 = 0;
                goto LAB_007a9943;
              }
              auVar64 = ZEXT3264(auVar62._0_32_);
              uVar30 = 0;
              uVar19 = 8;
              do {
                uVar23 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar30 * 8);
                if (uVar23 != 8) {
                  auVar56._4_4_ = fStack_271c;
                  auVar56._0_4_ = local_2720;
                  auVar56._8_4_ = fStack_2718;
                  auVar56._12_4_ = fStack_2714;
                  auVar56._16_4_ = fStack_2710;
                  auVar56._20_4_ = fStack_270c;
                  auVar56._24_4_ = fStack_2708;
                  auVar56._28_4_ = uStack_2704;
                  uVar21 = *(undefined4 *)(root.ptr + 0x20 + uVar30 * 4);
                  auVar57._4_4_ = uVar21;
                  auVar57._0_4_ = uVar21;
                  auVar57._8_4_ = uVar21;
                  auVar57._12_4_ = uVar21;
                  auVar57._16_4_ = uVar21;
                  auVar57._20_4_ = uVar21;
                  auVar57._24_4_ = uVar21;
                  auVar57._28_4_ = uVar21;
                  auVar31 = vfmsub132ps_fma(auVar57,auVar56,local_2780);
                  auVar12._4_4_ = fStack_26fc;
                  auVar12._0_4_ = local_2700;
                  auVar12._8_4_ = fStack_26f8;
                  auVar12._12_4_ = fStack_26f4;
                  auVar12._16_4_ = fStack_26f0;
                  auVar12._20_4_ = fStack_26ec;
                  auVar12._24_4_ = fStack_26e8;
                  auVar12._28_4_ = uStack_26e4;
                  uVar21 = *(undefined4 *)(root.ptr + 0x40 + uVar30 * 4);
                  auVar58._4_4_ = uVar21;
                  auVar58._0_4_ = uVar21;
                  auVar58._8_4_ = uVar21;
                  auVar58._12_4_ = uVar21;
                  auVar58._16_4_ = uVar21;
                  auVar58._20_4_ = uVar21;
                  auVar58._24_4_ = uVar21;
                  auVar58._28_4_ = uVar21;
                  uVar21 = *(undefined4 *)(root.ptr + 0x60 + uVar30 * 4);
                  auVar59._4_4_ = uVar21;
                  auVar59._0_4_ = uVar21;
                  auVar59._8_4_ = uVar21;
                  auVar59._12_4_ = uVar21;
                  auVar59._16_4_ = uVar21;
                  auVar59._20_4_ = uVar21;
                  auVar59._24_4_ = uVar21;
                  auVar59._28_4_ = uVar21;
                  auVar32 = vfmsub132ps_fma(auVar58,auVar12,local_2760);
                  auVar33 = vfmsub132ps_fma(auVar59,local_26e0,local_2740);
                  uVar21 = *(undefined4 *)(root.ptr + 0x30 + uVar30 * 4);
                  auVar52._4_4_ = uVar21;
                  auVar52._0_4_ = uVar21;
                  auVar52._8_4_ = uVar21;
                  auVar52._12_4_ = uVar21;
                  auVar52._16_4_ = uVar21;
                  auVar52._20_4_ = uVar21;
                  auVar52._24_4_ = uVar21;
                  auVar52._28_4_ = uVar21;
                  auVar40 = vfmsub132ps_avx512vl(local_2780,auVar56,auVar52);
                  uVar21 = *(undefined4 *)(root.ptr + 0x50 + uVar30 * 4);
                  auVar53._4_4_ = uVar21;
                  auVar53._0_4_ = uVar21;
                  auVar53._8_4_ = uVar21;
                  auVar53._12_4_ = uVar21;
                  auVar53._16_4_ = uVar21;
                  auVar53._20_4_ = uVar21;
                  auVar53._24_4_ = uVar21;
                  auVar53._28_4_ = uVar21;
                  auVar37 = vfmsub132ps_avx512vl(local_2760,auVar12,auVar53);
                  uVar21 = *(undefined4 *)(root.ptr + 0x70 + uVar30 * 4);
                  auVar55._4_4_ = uVar21;
                  auVar55._0_4_ = uVar21;
                  auVar55._8_4_ = uVar21;
                  auVar55._12_4_ = uVar21;
                  auVar55._16_4_ = uVar21;
                  auVar55._20_4_ = uVar21;
                  auVar55._24_4_ = uVar21;
                  auVar55._28_4_ = uVar21;
                  auVar41 = vfmsub132ps_avx512vl(local_2740,local_26e0,auVar55);
                  auVar39 = vpminsd_avx2(ZEXT1632(auVar31),auVar40);
                  auVar38 = vpminsd_avx2(ZEXT1632(auVar32),auVar37);
                  auVar39 = vpmaxsd_avx2(auVar39,auVar38);
                  auVar38 = vpminsd_avx2(ZEXT1632(auVar33),auVar41);
                  auVar39 = vpmaxsd_avx2(auVar39,auVar38);
                  auVar38 = vpmaxsd_avx2(ZEXT1632(auVar31),auVar40);
                  auVar40 = vpmaxsd_avx2(ZEXT1632(auVar32),auVar37);
                  auVar40 = vpminsd_avx2(auVar38,auVar40);
                  auVar38 = vpmaxsd_avx2(ZEXT1632(auVar33),auVar41);
                  auVar40 = vpminsd_avx2(auVar40,auVar38);
                  auVar13._4_4_ = uStack_265c;
                  auVar13._0_4_ = local_2660;
                  auVar13._8_4_ = uStack_2658;
                  auVar13._12_4_ = uStack_2654;
                  auVar13._16_4_ = uStack_2650;
                  auVar13._20_4_ = uStack_264c;
                  auVar13._24_4_ = uStack_2648;
                  auVar13._28_4_ = uStack_2644;
                  auVar38 = vpmaxsd_avx2(auVar39,auVar13);
                  auVar14._4_4_ = uStack_263c;
                  auVar14._0_4_ = local_2640;
                  auVar14._8_4_ = uStack_2638;
                  auVar14._12_4_ = uStack_2634;
                  auVar14._16_4_ = uStack_2630;
                  auVar14._20_4_ = uStack_262c;
                  auVar14._24_4_ = uStack_2628;
                  auVar14._28_4_ = uStack_2624;
                  auVar40 = vpminsd_avx2(auVar40,auVar14);
                  uVar24 = vpcmpd_avx512vl(auVar38,auVar40,2);
                  if ((byte)uVar24 != 0) {
                    auVar38 = vblendmps_avx512vl(auVar62._0_32_,auVar39);
                    bVar29 = (bool)((byte)uVar24 & 1);
                    bVar3 = (bool)((byte)(uVar24 >> 1) & 1);
                    bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
                    bVar5 = (bool)((byte)(uVar24 >> 3) & 1);
                    bVar6 = (bool)((byte)(uVar24 >> 4) & 1);
                    bVar7 = (bool)((byte)(uVar24 >> 5) & 1);
                    bVar8 = (bool)((byte)(uVar24 >> 6) & 1);
                    bVar9 = SUB81(uVar24 >> 7,0);
                    if (uVar19 != 8) {
                      *puVar26 = uVar19;
                      puVar26 = puVar26 + 1;
                      *pauVar28 = auVar64._0_32_;
                      pauVar28 = pauVar28 + 1;
                    }
                    auVar64 = ZEXT3264(CONCAT428((uint)bVar9 * auVar38._28_4_ |
                                                 (uint)!bVar9 * auVar39._28_4_,
                                                 CONCAT424((uint)bVar8 * auVar38._24_4_ |
                                                           (uint)!bVar8 * auVar39._24_4_,
                                                           CONCAT420((uint)bVar7 * auVar38._20_4_ |
                                                                     (uint)!bVar7 * auVar39._20_4_,
                                                                     CONCAT416((uint)bVar6 *
                                                                               auVar38._16_4_ |
                                                                               (uint)!bVar6 *
                                                                               auVar39._16_4_,
                                                                               CONCAT412((uint)bVar5
                                                                                         * auVar38.
                                                  _12_4_ | (uint)!bVar5 * auVar39._12_4_,
                                                  CONCAT48((uint)bVar4 * auVar38._8_4_ |
                                                           (uint)!bVar4 * auVar39._8_4_,
                                                           CONCAT44((uint)bVar3 * auVar38._4_4_ |
                                                                    (uint)!bVar3 * auVar39._4_4_,
                                                                    (uint)bVar29 * auVar38._0_4_ |
                                                                    (uint)!bVar29 * auVar39._0_4_)))
                                                  )))));
                    uVar19 = uVar23;
                  }
                }
                local_2880 = auVar64._0_32_;
              } while ((uVar23 != 8) && (bVar29 = uVar30 < 3, uVar30 = uVar30 + 1, bVar29));
              iVar16 = 0;
              if (uVar19 == 8) {
LAB_007a9896:
                bVar29 = false;
                iVar16 = 4;
              }
              else {
                auVar15._4_4_ = uStack_263c;
                auVar15._0_4_ = local_2640;
                auVar15._8_4_ = uStack_2638;
                auVar15._12_4_ = uStack_2634;
                auVar15._16_4_ = uStack_2630;
                auVar15._20_4_ = uStack_262c;
                auVar15._24_4_ = uStack_2628;
                auVar15._28_4_ = uStack_2624;
                uVar10 = vcmpps_avx512vl(local_2880,auVar15,9);
                bVar29 = true;
                if ((uint)POPCOUNT((int)uVar10) <= uVar20) {
                  *puVar26 = uVar19;
                  puVar26 = puVar26 + 1;
                  *pauVar28 = local_2880;
                  pauVar28 = pauVar28 + 1;
                  goto LAB_007a9896;
                }
              }
              root.ptr = uVar19;
            } while (bVar29);
          }
        }
        goto LAB_007a9de3;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar19 = uVar19 + 1;
    lVar27 = lVar27 + 0xe0;
    if (uVar30 - 8 <= uVar19) break;
LAB_007a9943:
    uVar23 = 0;
    bVar22 = bVar17;
    while (uVar24 = (ulong)*(uint *)(lVar27 + uVar23 * 4), uVar24 != 0xffffffff) {
      auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0xc0 + uVar23 * 4)));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0xb0 + uVar23 * 4)));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0xa0 + uVar23 * 4)));
      uVar21 = *(undefined4 *)(lVar27 + -0x90 + uVar23 * 4);
      auVar31._4_4_ = uVar21;
      auVar31._0_4_ = uVar21;
      auVar31._8_4_ = uVar21;
      auVar31._12_4_ = uVar21;
      auVar61._16_4_ = uVar21;
      auVar61._0_16_ = auVar31;
      auVar61._20_4_ = uVar21;
      auVar61._24_4_ = uVar21;
      auVar61._28_4_ = uVar21;
      uVar21 = *(undefined4 *)(lVar27 + -0x80 + uVar23 * 4);
      auVar32._4_4_ = uVar21;
      auVar32._0_4_ = uVar21;
      auVar32._8_4_ = uVar21;
      auVar32._12_4_ = uVar21;
      auVar63._16_4_ = uVar21;
      auVar63._0_16_ = auVar32;
      auVar63._20_4_ = uVar21;
      auVar63._24_4_ = uVar21;
      auVar63._28_4_ = uVar21;
      uVar21 = *(undefined4 *)(lVar27 + -0x70 + uVar23 * 4);
      auVar33._4_4_ = uVar21;
      auVar33._0_4_ = uVar21;
      auVar33._8_4_ = uVar21;
      auVar33._12_4_ = uVar21;
      auVar65._16_4_ = uVar21;
      auVar65._0_16_ = auVar33;
      auVar65._20_4_ = uVar21;
      auVar65._24_4_ = uVar21;
      auVar65._28_4_ = uVar21;
      uVar21 = *(undefined4 *)(lVar27 + -0x30 + uVar23 * 4);
      auVar34._4_4_ = uVar21;
      auVar34._0_4_ = uVar21;
      auVar34._8_4_ = uVar21;
      auVar34._12_4_ = uVar21;
      auVar66._16_4_ = uVar21;
      auVar66._0_16_ = auVar34;
      auVar66._20_4_ = uVar21;
      auVar66._24_4_ = uVar21;
      auVar66._28_4_ = uVar21;
      uVar1 = *(undefined4 *)(lVar27 + -0x20 + uVar23 * 4);
      auVar35._4_4_ = uVar1;
      auVar35._0_4_ = uVar1;
      auVar35._8_4_ = uVar1;
      auVar35._12_4_ = uVar1;
      auVar67._16_4_ = uVar1;
      auVar67._0_16_ = auVar35;
      auVar67._20_4_ = uVar1;
      auVar67._24_4_ = uVar1;
      auVar67._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar27 + -0x10 + uVar23 * 4);
      auVar36._4_4_ = uVar1;
      auVar36._0_4_ = uVar1;
      auVar36._8_4_ = uVar1;
      auVar36._12_4_ = uVar1;
      auVar68._16_4_ = uVar1;
      auVar68._0_16_ = auVar36;
      auVar68._20_4_ = uVar1;
      auVar68._24_4_ = uVar1;
      auVar68._28_4_ = uVar1;
      auVar31 = vsubss_avx512f(auVar37._0_16_,auVar31);
      auVar43 = vbroadcastss_avx512vl(auVar31);
      auVar32 = vsubss_avx512f(auVar41._0_16_,auVar32);
      auVar44 = vbroadcastss_avx512vl(auVar32);
      auVar33 = vsubss_avx512f(auVar42._0_16_,auVar33);
      auVar45 = vbroadcastss_avx512vl(auVar33);
      auVar34 = vsubss_avx512f(auVar34,auVar37._0_16_);
      auVar46 = vbroadcastss_avx512vl(auVar34);
      auVar35 = vsubss_avx512f(auVar35,auVar41._0_16_);
      auVar47 = vbroadcastss_avx512vl(auVar35);
      auVar36 = vsubss_avx512f(auVar36,auVar42._0_16_);
      auVar48 = vbroadcastss_avx512vl(auVar36);
      auVar32 = vmulss_avx512f(auVar32,auVar36);
      auVar49 = vbroadcastss_avx512vl(auVar32);
      auVar50 = vfmsub231ps_avx512vl(auVar49,auVar47,auVar45);
      auVar32 = vmulss_avx512f(auVar33,auVar34);
      auVar49 = vbroadcastss_avx512vl(auVar32);
      auVar51 = vfmsub231ps_avx512vl(auVar49,auVar48,auVar43);
      auVar31 = vmulss_avx512f(auVar31,auVar35);
      auVar49 = vbroadcastss_avx512vl(auVar31);
      auVar52 = vfmsub231ps_avx512vl(auVar49,auVar46,auVar44);
      auVar37 = vsubps_avx512vl(auVar37,*(undefined1 (*) [32])local_2898);
      auVar41 = vsubps_avx512vl(auVar41,*(undefined1 (*) [32])(local_2898 + 0x20));
      auVar42 = vsubps_avx512vl(auVar42,*(undefined1 (*) [32])(local_2898 + 0x40));
      auVar49 = vmulps_avx512vl(auVar39,auVar42);
      auVar53 = vfmsub231ps_avx512vl(auVar49,auVar41,auVar38);
      auVar49 = vmulps_avx512vl(auVar38,auVar37);
      auVar54 = vfmsub231ps_avx512vl(auVar49,auVar42,auVar40);
      auVar49 = vmulps_avx512vl(auVar40,auVar41);
      auVar55 = vfmsub231ps_avx512vl(auVar49,auVar37,auVar39);
      auVar49 = vmulps_avx512vl(auVar52,auVar38);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar51,auVar39);
      auVar56 = vfmadd231ps_avx512vl(auVar49,auVar50,auVar40);
      auVar49._8_4_ = 0x80000000;
      auVar49._0_8_ = 0x8000000080000000;
      auVar49._12_4_ = 0x80000000;
      auVar49._16_4_ = 0x80000000;
      auVar49._20_4_ = 0x80000000;
      auVar49._24_4_ = 0x80000000;
      auVar49._28_4_ = 0x80000000;
      vandps_avx512vl(auVar56,auVar49);
      auVar49 = vmulps_avx512vl(auVar48,auVar55);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar54,auVar47);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar53,auVar46);
      auVar49 = vxorps_avx512vl(auVar56,auVar49);
      uVar10 = vcmpps_avx512vl(auVar49,_DAT_02020f00,5);
      bVar25 = (byte)uVar10 & bVar22;
      if (bVar25 != 0) {
        auVar45 = vmulps_avx512vl(auVar45,auVar55);
        auVar44 = vfmadd213ps_avx512vl(auVar44,auVar54,auVar45);
        auVar43 = vfmadd213ps_avx512vl(auVar43,auVar53,auVar44);
        auVar43 = vxorps_avx512vl(auVar56,auVar43);
        uVar10 = vcmpps_avx512vl(auVar43,_DAT_02020f00,5);
        bVar25 = bVar25 & (byte)uVar10;
        if (bVar25 != 0) {
          auVar45._8_4_ = 0x7fffffff;
          auVar45._0_8_ = 0x7fffffff7fffffff;
          auVar45._12_4_ = 0x7fffffff;
          auVar45._16_4_ = 0x7fffffff;
          auVar45._20_4_ = 0x7fffffff;
          auVar45._24_4_ = 0x7fffffff;
          auVar45._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar56,auVar45);
          auVar44 = vsubps_avx512vl(auVar43,auVar49);
          uVar10 = vcmpps_avx512vl(auVar44,auVar43,5);
          bVar25 = bVar25 & (byte)uVar10;
          if (bVar25 != 0) {
            auVar42 = vmulps_avx512vl(auVar52,auVar42);
            auVar41 = vfmadd213ps_avx512vl(auVar41,auVar51,auVar42);
            auVar37 = vfmadd213ps_avx512vl(auVar37,auVar50,auVar41);
            auVar37 = vxorps_avx512vl(auVar56,auVar37);
            auVar41 = vmulps_avx512vl(auVar43,*(undefined1 (*) [32])(local_2898 + 0x60));
            auVar42 = vmulps_avx512vl(auVar43,*(undefined1 (*) [32])(local_2898 + 0x100));
            uVar10 = vcmpps_avx512vl(auVar37,auVar42,2);
            uVar11 = vcmpps_avx512vl(auVar41,auVar37,1);
            bVar25 = bVar25 & (byte)uVar10 & (byte)uVar11;
            if (bVar25 != 0) {
              uVar10 = vcmpps_avx512vl(auVar56,_DAT_02020f00,4);
              bVar25 = bVar25 & (byte)uVar10;
              if (bVar25 != 0) {
                uVar2 = ((local_2890->scene->geometries).items[uVar24].ptr)->mask;
                auVar46._4_4_ = uVar2;
                auVar46._0_4_ = uVar2;
                auVar46._8_4_ = uVar2;
                auVar46._12_4_ = uVar2;
                auVar46._16_4_ = uVar2;
                auVar46._20_4_ = uVar2;
                auVar46._24_4_ = uVar2;
                auVar46._28_4_ = uVar2;
                uVar10 = vptestmd_avx512vl(*(undefined1 (*) [32])(local_2898 + 0x120),auVar46);
                bVar25 = bVar25 & (byte)uVar10;
                if (bVar25 != 0) {
                  bVar22 = bVar22 & ~bVar25;
                }
              }
            }
          }
        }
      }
      if (bVar22 == 0) {
        bVar29 = false;
      }
      else {
        uVar1 = *(undefined4 *)(lVar27 + -0x60 + uVar23 * 4);
        auVar54._4_4_ = uVar1;
        auVar54._0_4_ = uVar1;
        auVar54._8_4_ = uVar1;
        auVar54._12_4_ = uVar1;
        auVar54._16_4_ = uVar1;
        auVar54._20_4_ = uVar1;
        auVar54._24_4_ = uVar1;
        auVar54._28_4_ = uVar1;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x50 + uVar23 * 4)));
        auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x40 + uVar23 * 4)));
        auVar43 = vsubps_avx512vl(auVar54,auVar66);
        auVar44 = vsubps_avx512vl(auVar41,auVar67);
        auVar49 = vsubps_avx512vl(auVar42,auVar68);
        auVar45 = vsubps_avx512vl(auVar61,auVar54);
        auVar46 = vsubps_avx512vl(auVar63,auVar41);
        auVar50 = vsubps_avx512vl(auVar65,auVar42);
        auVar37 = vmulps_avx512vl(auVar44,auVar50);
        auVar51 = vfmsub231ps_avx512vl(auVar37,auVar46,auVar49);
        auVar37 = vmulps_avx512vl(auVar49,auVar45);
        auVar52 = vfmsub231ps_avx512vl(auVar37,auVar50,auVar43);
        auVar37 = vmulps_avx512vl(auVar43,auVar46);
        auVar53 = vfmsub231ps_avx512vl(auVar37,auVar45,auVar44);
        auVar37 = vsubps_avx(auVar54,*(undefined1 (*) [32])local_2898);
        auVar41 = vsubps_avx512vl(auVar41,*(undefined1 (*) [32])(local_2898 + 0x20));
        auVar42 = vsubps_avx512vl(auVar42,*(undefined1 (*) [32])(local_2898 + 0x40));
        auVar47 = vmulps_avx512vl(auVar39,auVar42);
        auVar54 = vfmsub231ps_avx512vl(auVar47,auVar41,auVar38);
        auVar47 = vmulps_avx512vl(auVar38,auVar37);
        auVar55 = vfmsub231ps_avx512vl(auVar47,auVar42,auVar40);
        auVar47 = vmulps_avx512vl(auVar40,auVar41);
        auVar56 = vfmsub231ps_avx512vl(auVar47,auVar37,auVar39);
        auVar48._4_4_ = auVar53._4_4_ * auVar38._4_4_;
        auVar48._0_4_ = auVar53._0_4_ * auVar38._0_4_;
        auVar48._8_4_ = auVar53._8_4_ * auVar38._8_4_;
        auVar48._12_4_ = auVar53._12_4_ * auVar38._12_4_;
        auVar48._16_4_ = auVar53._16_4_ * auVar38._16_4_;
        auVar48._20_4_ = auVar53._20_4_ * auVar38._20_4_;
        auVar48._24_4_ = auVar53._24_4_ * auVar38._24_4_;
        auVar48._28_4_ = uVar21;
        auVar31 = vfmadd231ps_fma(auVar48,auVar52,auVar39);
        auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar51,auVar40);
        auVar47._8_4_ = 0x80000000;
        auVar47._0_8_ = 0x8000000080000000;
        auVar47._12_4_ = 0x80000000;
        auVar47._16_4_ = 0x80000000;
        auVar47._20_4_ = 0x80000000;
        auVar47._24_4_ = 0x80000000;
        auVar47._28_4_ = 0x80000000;
        vandps_avx512vl(ZEXT1632(auVar31),auVar47);
        auVar47 = vmulps_avx512vl(auVar50,auVar56);
        auVar46 = vfmadd231ps_avx512vl(auVar47,auVar55,auVar46);
        auVar45 = vfmadd231ps_avx512vl(auVar46,auVar54,auVar45);
        auVar45 = vxorps_avx512vl(auVar56,auVar45);
        uVar10 = vcmpps_avx512vl(auVar45,_DAT_02020f00,5);
        bVar25 = (byte)uVar10 & bVar22;
        if (bVar25 != 0) {
          auVar49 = vmulps_avx512vl(auVar49,auVar56);
          auVar44 = vfmadd213ps_avx512vl(auVar44,auVar55,auVar49);
          auVar43 = vfmadd213ps_avx512vl(auVar43,auVar54,auVar44);
          auVar43 = vxorps_avx512vl(auVar56,auVar43);
          uVar10 = vcmpps_avx512vl(auVar43,_DAT_02020f00,5);
          bVar25 = bVar25 & (byte)uVar10;
          if (bVar25 != 0) {
            auVar50._8_4_ = 0x7fffffff;
            auVar50._0_8_ = 0x7fffffff7fffffff;
            auVar50._12_4_ = 0x7fffffff;
            auVar50._16_4_ = 0x7fffffff;
            auVar50._20_4_ = 0x7fffffff;
            auVar50._24_4_ = 0x7fffffff;
            auVar50._28_4_ = 0x7fffffff;
            vandps_avx512vl(ZEXT1632(auVar31),auVar50);
            auVar44 = vsubps_avx512vl(auVar43,auVar45);
            uVar10 = vcmpps_avx512vl(auVar44,auVar43,5);
            bVar25 = bVar25 & (byte)uVar10;
            if (bVar25 != 0) {
              auVar42 = vmulps_avx512vl(auVar53,auVar42);
              auVar32 = vfmadd213ps_fma(auVar41,auVar52,auVar42);
              auVar32 = vfmadd213ps_fma(auVar37,auVar51,ZEXT1632(auVar32));
              auVar37 = vxorps_avx512vl(auVar56,ZEXT1632(auVar32));
              auVar41 = vmulps_avx512vl(auVar43,*(undefined1 (*) [32])(local_2898 + 0x60));
              auVar42 = vmulps_avx512vl(auVar43,*(undefined1 (*) [32])(local_2898 + 0x100));
              uVar10 = vcmpps_avx512vl(auVar37,auVar42,2);
              uVar11 = vcmpps_avx512vl(auVar41,auVar37,1);
              bVar25 = bVar25 & (byte)uVar10 & (byte)uVar11;
              if (bVar25 != 0) {
                uVar10 = vcmpps_avx512vl(ZEXT1632(auVar31),_DAT_02020f00,4);
                bVar25 = bVar25 & (byte)uVar10;
                if (bVar25 != 0) {
                  uVar2 = ((local_2890->scene->geometries).items[uVar24].ptr)->mask;
                  auVar51._4_4_ = uVar2;
                  auVar51._0_4_ = uVar2;
                  auVar51._8_4_ = uVar2;
                  auVar51._12_4_ = uVar2;
                  auVar51._16_4_ = uVar2;
                  auVar51._20_4_ = uVar2;
                  auVar51._24_4_ = uVar2;
                  auVar51._28_4_ = uVar2;
                  uVar10 = vptestmd_avx512vl(*(undefined1 (*) [32])(local_2898 + 0x120),auVar51);
                  bVar25 = bVar25 & (byte)uVar10;
                  if (bVar25 != 0) {
                    bVar22 = bVar22 & ~bVar25;
                  }
                }
              }
            }
          }
        }
        bVar29 = bVar22 != 0;
      }
      auVar62 = ZEXT3264(CONCAT428(0x7f800000,
                                   CONCAT424(0x7f800000,
                                             CONCAT420(0x7f800000,
                                                       CONCAT416(0x7f800000,
                                                                 CONCAT412(0x7f800000,
                                                                           CONCAT48(0x7f800000,
                                                                                                                                                                        
                                                  0x7f8000007f800000)))))));
      if ((!bVar29) || (bVar29 = 2 < uVar23, uVar23 = uVar23 + 1, bVar29)) break;
    }
    bVar17 = bVar17 & bVar22;
    if (bVar17 == 0) break;
  }
  bVar17 = ~bVar17;
LAB_007a9dba:
  bVar18 = bVar18 | bVar17;
  if (bVar18 == 0xff) {
LAB_007a9de0:
    iVar16 = 3;
  }
  else {
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    local_2640 = (uint)(bVar18 & 1) * auVar39._0_4_ | !(bool)(bVar18 & 1) * local_2640;
    bVar29 = (bool)(bVar18 >> 1 & 1);
    uStack_263c = (uint)bVar29 * auVar39._4_4_ | !bVar29 * uStack_263c;
    bVar29 = (bool)(bVar18 >> 2 & 1);
    uStack_2638 = (uint)bVar29 * auVar39._8_4_ | !bVar29 * uStack_2638;
    bVar29 = (bool)(bVar18 >> 3 & 1);
    uStack_2634 = (uint)bVar29 * auVar39._12_4_ | !bVar29 * uStack_2634;
    bVar29 = (bool)(bVar18 >> 4 & 1);
    uStack_2630 = (uint)bVar29 * auVar39._16_4_ | !bVar29 * uStack_2630;
    bVar29 = (bool)(bVar18 >> 5 & 1);
    uStack_262c = (uint)bVar29 * auVar39._20_4_ | !bVar29 * uStack_262c;
    bVar29 = (bool)(bVar18 >> 6 & 1);
    uStack_2628 = (uint)bVar29 * auVar39._24_4_ | !bVar29 * uStack_2628;
    uStack_2624 = (uint)(bVar18 >> 7) * auVar39._28_4_ | !(bool)(bVar18 >> 7) * uStack_2624;
    iVar16 = 0;
  }
LAB_007a9de3:
  if (iVar16 == 3) {
    bVar18 = bVar18 & (byte)local_28a4;
    bVar29 = (bool)(bVar18 >> 1 & 1);
    bVar3 = (bool)(bVar18 >> 2 & 1);
    bVar4 = (bool)(bVar18 >> 3 & 1);
    bVar5 = (bool)(bVar18 >> 4 & 1);
    bVar6 = (bool)(bVar18 >> 5 & 1);
    bVar7 = (bool)(bVar18 >> 6 & 1);
    *(uint *)local_2888 =
         (uint)(bVar18 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar18 & 1) * *(int *)local_2888;
    *(uint *)(local_2888 + 4) =
         (uint)bVar29 * auVar60._4_4_ | (uint)!bVar29 * *(int *)(local_2888 + 4);
    *(uint *)(local_2888 + 8) =
         (uint)bVar3 * auVar60._8_4_ | (uint)!bVar3 * *(int *)(local_2888 + 8);
    *(uint *)(local_2888 + 0xc) =
         (uint)bVar4 * auVar60._12_4_ | (uint)!bVar4 * *(int *)(local_2888 + 0xc);
    *(uint *)(local_2888 + 0x10) =
         (uint)bVar5 * auVar60._16_4_ | (uint)!bVar5 * *(int *)(local_2888 + 0x10);
    *(uint *)(local_2888 + 0x14) =
         (uint)bVar6 * auVar60._20_4_ | (uint)!bVar6 * *(int *)(local_2888 + 0x14);
    *(uint *)(local_2888 + 0x18) =
         (uint)bVar7 * auVar60._24_4_ | (uint)!bVar7 * *(int *)(local_2888 + 0x18);
    *(uint *)(local_2888 + 0x1c) =
         (uint)(bVar18 >> 7) * auVar60._28_4_ |
         (uint)!(bool)(bVar18 >> 7) * *(int *)(local_2888 + 0x1c);
    return;
  }
  goto LAB_007a96cb;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }